

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O2

int mov_a_indir_rx(em8051 *aCPU)

{
  uchar uVar1;
  uchar *puVar2;
  byte bVar3;
  
  puVar2 = aCPU->mLowerData;
  bVar3 = puVar2[aCPU->mSFR[0x50] & 0x18 |
                 aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aCPU->mPC] & 1];
  if ((char)bVar3 < '\0') {
    puVar2 = aCPU->mUpperData;
    if (puVar2 == (uchar *)0x0) {
      uVar1 = 'w';
      goto LAB_00108f1f;
    }
    bVar3 = bVar3 & 0x7f;
  }
  uVar1 = puVar2[bVar3];
LAB_00108f1f:
  aCPU->mSFR[0x60] = uVar1;
  aCPU->mPC = aCPU->mPC + 1;
  return 0;
}

Assistant:

static int mov_a_indir_rx(struct em8051 *aCPU)
{
    int address = INDIR_RX_ADDRESS;
    if (address > 0x7f)
    {
        int value = BAD_VALUE;
        if (aCPU->mUpperData)
        {
            value = aCPU->mUpperData[address - 0x80];
        }

        ACC = value;
    }
    else
    {
        ACC = aCPU->mLowerData[address];
    }

    PC++;
    return 0;
}